

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

real __thiscall
fasttext::BinaryLogisticLoss::binaryLogistic
          (BinaryLogisticLoss *this,int32_t target,State *state,bool labelIsPositive,real lr,
          bool backprop)

{
  element_type *peVar1;
  undefined1 in_CL;
  Vector *in_RDX;
  int in_ESI;
  Loss *in_RDI;
  undefined1 in_R8B;
  float in_XMM0_Da;
  real rVar2;
  double dVar3;
  undefined1 auVar4 [16];
  real alpha;
  real score;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  float a;
  undefined3 in_stack_ffffffffffffffd4;
  uint uVar5;
  undefined3 in_stack_ffffffffffffffdc;
  uint uVar6;
  real local_4;
  
  uVar6 = CONCAT13(in_CL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  uVar5 = CONCAT13(in_R8B,in_stack_ffffffffffffffd4) & 0x1ffffff;
  peVar1 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x188ffb);
  (*peVar1->_vptr_Matrix[2])
            (peVar1,&(in_RDX->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  rVar2 = Loss::sigmoid((Loss *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        (real)((ulong)in_RDI >> 0x20));
  if ((uVar5 & 0x1000000) != 0) {
    a = in_XMM0_Da * ((float)((byte)(uVar6 >> 0x18) & 1) - rVar2);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_RDI);
    Vector::addRow(in_RDX,(Matrix *)CONCAT44(uVar6,in_XMM0_Da),CONCAT44(uVar5,rVar2),a);
    peVar1 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x189091);
    (*peVar1->_vptr_Matrix[3])
              ((ulong)(uint)a,peVar1,
               &(in_RDX->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  }
  if ((uVar6 & 0x1000000) == 0) {
    auVar4._4_12_ = SUB1612(ZEXT816(0x3ff0000000000000),4);
    auVar4._0_4_ = 1.0 - rVar2;
    dVar3 = Loss::log(in_RDI,auVar4._0_8_);
    local_4 = SUB84(dVar3,0);
  }
  else {
    dVar3 = Loss::log(in_RDI,(double)(ulong)(uint)rVar2);
    local_4 = SUB84(dVar3,0);
  }
  local_4 = -local_4;
  return local_4;
}

Assistant:

real BinaryLogisticLoss::binaryLogistic(
    int32_t target,
    Model::State& state,
    bool labelIsPositive,
    real lr,
    bool backprop) const {
  real score = sigmoid(wo_->dotRow(state.hidden, target));
  if (backprop) {
    real alpha = lr * (real(labelIsPositive) - score);
    state.grad.addRow(*wo_, target, alpha);
    wo_->addVectorToRow(state.hidden, target, alpha);
  }
  if (labelIsPositive) {
    return -log(score);
  } else {
    return -log(1.0 - score);
  }
}